

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

char * context_name_of(char *symbolic_name)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strchr(symbolic_name,0x3a);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = (char *)string_dup(symbolic_name);
    pcVar2 = strchr(pcVar1,0x3a);
    *pcVar2 = '\0';
    return pcVar1;
  }
  pcVar1 = (char *)string_dup("default");
  return pcVar1;
}

Assistant:

static char *context_name_of(const char* symbolic_name) {
    char *context_name;

    if (strchr(symbolic_name, ':')) {
        context_name = string_dup(symbolic_name);
        *strchr(context_name, ':') = '\0';
    } else {
        context_name = string_dup(CGREEN_DEFAULT_SUITE);
    }

    return context_name;
}